

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::ExtensionSet(ExtensionSet *this,Arena *arena)

{
  ulong uVar1;
  unsigned_long uVar2;
  long in_RSI;
  long *in_RDI;
  size_t n;
  LogMessage *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  LogMessage *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  LogMessage *this_00;
  void *local_f8;
  void *local_70;
  LogMessage local_48;
  ulong local_10;
  LogMessage *local_8;
  
  *in_RDI = in_RSI;
  *(undefined2 *)(in_RDI + 1) = 0;
  *(undefined2 *)((long)in_RDI + 10) = 0;
  if ((short)in_RDI[1] == 0) {
    local_f8 = (void *)0x0;
  }
  else {
    this_00 = (LogMessage *)*in_RDI;
    uVar1 = (ulong)*(ushort *)(in_RDI + 1);
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (uVar2 >> 5 < uVar1) {
      LogMessage::LogMessage
                (in_stack_fffffffffffffed0,(LogLevel)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      LogMessage::~LogMessage((LogMessage *)0x49d2f0);
    }
    if (this_00 == (LogMessage *)0x0) {
      local_70 = operator_new__(uVar1 << 5);
    }
    else {
      local_10 = uVar1;
      local_8 = this_00;
      uVar2 = std::numeric_limits<unsigned_long>::max();
      if (uVar2 >> 5 < uVar1) {
        in_stack_fffffffffffffec0 = &local_48;
        LogMessage::LogMessage
                  (this_00,(LogLevel)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                  );
        in_stack_fffffffffffffec8 =
             LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffeb8 =
             LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        LogMessage::~LogMessage((LogMessage *)0x49d437);
      }
      AlignUpTo8(local_10 << 5);
      ArenaImpl::RecordAlloc
                ((ArenaImpl *)this_00,(type_info *)in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0);
      local_70 = Arena::AllocateAlignedTo<8ul>
                           ((Arena *)in_stack_fffffffffffffec0,(size_t)in_stack_fffffffffffffeb8);
    }
    local_f8 = local_70;
  }
  in_RDI[2] = (long)local_f8;
  return;
}

Assistant:

ExtensionSet::ExtensionSet(Arena* arena)
    : arena_(arena),
      flat_capacity_(0),
      flat_size_(0),
      map_{flat_capacity_ == 0
               ? NULL
               : Arena::CreateArray<KeyValue>(arena_, flat_capacity_)} {}